

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

bool Catch::uncaught_exceptions(void)

{
  int iVar1;
  
  iVar1 = std::uncaught_exceptions();
  return 0 < iVar1;
}

Assistant:

bool uncaught_exceptions() {
    #if defined(CATCH_CONFIG_DISABLE_EXCEPTIONS)
        return false;
    #elif defined(CATCH_CONFIG_CPP17_UNCAUGHT_EXCEPTIONS)
        return std::uncaught_exceptions() > 0;
    #else
        return std::uncaught_exception();
    #endif
    }